

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_RepeatedAndSingular_Test::
TestBody(CollectFieldsTest_RepeatedAndSingular_Test *this)

{
  pointer *pppFVar1;
  byte bVar2;
  Nonnull<const_char_*> pcVar3;
  bool bVar4;
  byte bVar5;
  size_type in_RCX;
  bool v1;
  pointer ppFVar6;
  iterator __position;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *pcVar7;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  Span<const_char_*> field_names_00;
  FieldDescriptor *field;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  char *field_names [3];
  AssertHelper local_180;
  undefined1 local_178 [8];
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_170;
  bool local_161;
  AssertHelper local_160;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  local_158;
  undefined1 local_138 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  bool local_a8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined5 local_80;
  undefined3 uStack_7b;
  undefined5 uStack_78;
  bool local_73;
  undefined7 local_72;
  undefined4 uStack_6b;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_60;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  local_38 = "optional_int64";
  local_48 = "repeated_int32";
  pcStack_40 = "optional_int32";
  field_names_00.len_ = in_RCX;
  field_names_00.ptr_ = (pointer)0x3;
  CreateFieldArray<proto2_unittest::TestAllTypes>
            (&local_60,(anon_unknown_0 *)&local_48,field_names_00);
  local_128._M_allocated_capacity = (size_type)&local_118;
  local_138 = (undefined1  [8])0x0;
  _Stack_130._M_head_impl = (LogMessageData *)0x0;
  local_128._8_8_ = 0;
  local_118._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8 = false;
  local_a0.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_a0.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_a0.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_80 = 0;
  uStack_7b = 0;
  uStack_78._0_4_ = kNoEnforcement;
  uStack_78._4_1_ = false;
  local_73 = true;
  local_72._0_1_ = false;
  local_72._1_1_ = false;
  local_72._2_1_ = false;
  local_72._3_1_ = false;
  local_72._4_1_ = false;
  local_72._5_1_ = false;
  local_72._6_1_ = false;
  uStack_6b._0_1_ = false;
  uStack_6b._1_1_ = false;
  uStack_6b._2_1_ = false;
  uStack_6b._3_1_ = false;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_60.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppFVar6 = local_60.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_180.data_ = (AssertHelperData *)*ppFVar6;
      if (local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00a22ffc:
        bVar4 = protobuf::internal::cpp::HasHasbit((FieldDescriptor *)local_180.data_);
        local_178[0] = bVar4;
        local_160.data_._0_1_ =
             IsRarelyPresent((FieldDescriptor *)local_180.data_,(Options *)local_138);
        local_161 = ShouldSplit((FieldDescriptor *)local_180.data_,(Options *)local_138);
        std::
        vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
        ::emplace_back<bool,bool,bool>
                  ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                    *)&local_158,(bool *)local_178,(bool *)&local_160,&local_161);
        __position._M_current =
             local_158.
             super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        __position._M_current =
             local_158.
             super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = __position._M_current[-1]->field_0x1;
        bVar4 = (bool)((bVar2 & 0x20) >> 5);
        if (0xbf < bVar2 != bVar4) {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar4,0xbf < bVar2,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_178,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar3);
LAB_00a235c8:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_178);
        }
        bVar2 = ((FieldDescriptor *)local_180.data_)->field_0x1;
        in_R9B = 0xbf < bVar2;
        v1 = (bool)((bVar2 & 0x20) >> 5);
        if ((bool)in_R9B != v1) {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (v1,0xbf < bVar2,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_178,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar3);
          goto LAB_00a235c8;
        }
        if (bVar4 != v1) goto LAB_00a22ffc;
      }
      if (__position._M_current ==
          local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,
                   (FieldDescriptor **)&local_180);
      }
      else {
        *__position._M_current = (FieldDescriptor *)local_180.data_;
        pppFVar1 = &local_158.
                    super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 !=
             local_60.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_allocated_capacity != &local_118) {
    operator_delete((void *)local_128._M_allocated_capacity,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_178 = (undefined1  [8])
              ((long)local_158.
                     super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_158.
                     super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_180.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"chunks.size()","2",(unsigned_long *)local_178,(int *)&local_180)
  ;
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if (_Stack_130._M_head_impl == (LogMessageData *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (pointer)((_Stack_130._M_head_impl)->entry).full_filename_._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
               ,0x4d,message);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_178 + 8))();
    }
    if (_Stack_130._M_head_impl == (LogMessageData *)0x0) goto LAB_00a2352a;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&_Stack_130;
    __ptr._M_head_impl = _Stack_130._M_head_impl;
  }
  else {
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )_Stack_130._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_130._M_head_impl);
    }
    local_178 = (undefined1  [8])
                ((long)((local_158.
                         super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                         ._M_impl.super__Vector_impl_data._M_start)->fields).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)((local_158.
                         super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                         ._M_impl.super__Vector_impl_data._M_start)->fields).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_180.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_138,"chunks[0].fields.size()","1",(unsigned_long *)local_178,
               (int *)&local_180);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_178);
      if (_Stack_130._M_head_impl == (LogMessageData *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (char *)((_Stack_130._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x4f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if (local_178 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_178 + 8))();
      }
    }
    if (_Stack_130._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_130._M_head_impl);
    }
    bVar2 = (*((local_158.
                super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                ._M_impl.super__Vector_impl_data._M_start)->fields).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
    bVar5 = bVar2 & 0x20;
    if (0xbf < bVar2 != (bool)(bVar5 >> 5)) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar5 != 0,0xbf < bVar2,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar3);
LAB_00a23639:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_138);
    }
    local_178[0] = bVar5 >> 5;
    local_170._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )0x0;
    if (bVar5 == 0) {
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_138,(internal *)local_178,
                 (AssertionResult *)"chunks[0].fields.front()->is_repeated()","false","true",
                 (char *)CONCAT71(in_register_00000089,in_R9B));
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x50,(char *)local_138);
      testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      if (local_138 != (undefined1  [8])&local_128) {
        operator_delete((void *)local_138,(ulong)(local_128._M_allocated_capacity + 1));
      }
      if (local_180.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_180.data_ + 8))();
      }
      if (local_170._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_170._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl);
      }
    }
    local_178 = (undefined1  [8])
                ((long)local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_180.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_138,"chunks[1].fields.size()","2",(unsigned_long *)local_178,
               (int *)&local_180);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_178);
      if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )_Stack_130._M_head_impl ==
          (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = *(char **)_Stack_130._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x52,pcVar7);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if (local_178 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_178 + 8))();
      }
    }
    if (_Stack_130._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_130._M_head_impl);
    }
    bVar2 = (*local_158.
              super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
              ._M_impl.super__Vector_impl_data._M_start[1].fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
    bVar4 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar4) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar4,0xbf < bVar2,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar3);
      goto LAB_00a23639;
    }
    bVar4 = (bVar2 & 0x20) == 0;
    local_178[0] = bVar4;
    local_170._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )0x0;
    if (bVar4) goto LAB_00a2352a;
    testing::Message::Message((Message *)&local_180);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_170;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)local_178,
               (AssertionResult *)"chunks[1].fields.front()->is_repeated()","true","false",
               (char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
               ,0x53,(char *)local_138);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_138 != (undefined1  [8])&local_128) {
      operator_delete((void *)local_138,(ulong)(local_128._M_allocated_capacity + 1));
    }
    if (local_180.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_180.data_ + 8))();
    }
    __ptr._M_head_impl =
         (LogMessageData *)
         local_170._M_t.
         super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         .
         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
         ._M_head_impl;
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_170._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl == (LogMessageData *)0x0) goto LAB_00a2352a;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr._M_head_impl);
LAB_00a2352a:
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&local_158);
  if (local_60.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CollectFieldsTest, RepeatedAndSingular) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto fields = CreateFieldArray<TestAllTypes>(field_names);
  auto chunks = CollectFields(
      fields, {}, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return lhs->is_repeated() == rhs->is_repeated();
      });

  ASSERT_EQ(chunks.size(), 2);

  EXPECT_EQ(chunks[0].fields.size(), 1);
  EXPECT_TRUE(chunks[0].fields.front()->is_repeated());

  EXPECT_EQ(chunks[1].fields.size(), 2);
  EXPECT_FALSE(chunks[1].fields.front()->is_repeated());
}